

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void addgrams(vw *all,size_t ngram,size_t skip_gram,features *fs,size_t initial_length,
             v_array<unsigned_long> *gram_mask,size_t skips)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  feature_index *pfVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  vw *pvVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  feature_index i;
  ulong uVar4;
  allocator local_89;
  vw *local_88;
  features *local_80;
  long local_78;
  string local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [3];
  string feature_name;
  
  local_80 = fs;
  if (ngram == 0) {
    local_78 = initial_length - gram_mask->_end[-1];
    if (gram_mask->_end[-1] <= initial_length && local_78 != 0) {
      this = &fs->space_names;
      for (local_88 = (vw *)0x0; local_88 != (vw *)local_78; local_88 = (vw *)((long)local_88 + 1))
      {
        pfVar1 = (local_80->indicies)._begin + (long)local_88;
        i = *pfVar1;
        for (uVar4 = 1; uVar4 < (ulong)((long)gram_mask->_end - (long)gram_mask->_begin >> 3);
            uVar4 = uVar4 + 1) {
          i = i * 0x1aa5cfd + pfVar1[gram_mask->_begin[uVar4]];
        }
        features::push_back(local_80,1.0,i);
        pvVar3 = local_88;
        psVar2 = (local_80->space_names)._begin;
        if ((local_80->space_names)._end != psVar2) {
          std::__cxx11::string::string
                    ((string *)&feature_name,
                     (string *)
                     &(psVar2[(long)local_88].
                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->second);
          for (uVar4 = 1; uVar4 < (ulong)((long)gram_mask->_end - (long)gram_mask->_begin >> 3);
              uVar4 = uVar4 + 1) {
            std::__cxx11::string::string(local_70,"^",&local_89);
            std::__cxx11::string::append((string *)&feature_name);
            std::__cxx11::string::~string(local_70);
            std::__cxx11::string::string
                      (local_70,(string *)
                                &(this->_begin[(long)pvVar3 + gram_mask->_begin[uVar4]].
                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->second);
            std::__cxx11::string::append((string *)&feature_name);
            std::__cxx11::string::~string(local_70);
          }
          this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)operator_new(0x40);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (this_00,&(this->_begin[(long)pvVar3].
                               super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->first,&feature_name);
          std::
          __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                    ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                      *)local_70,this_00);
          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(this,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
          std::__cxx11::string::~string((string *)&feature_name);
        }
      }
    }
  }
  else {
    local_78 = CONCAT71(local_78._1_7_,ngram == 0);
    feature_name._M_dataplus._M_p = (pointer)(gram_mask->_end[-1] + skips + 1);
    local_88 = all;
    v_array<unsigned_long>::push_back(gram_mask,(unsigned_long *)&feature_name);
    addgrams(local_88,ngram - 1,skip_gram,local_80,initial_length,gram_mask,0);
    gram_mask->_end = gram_mask->_end + -1;
    if (skip_gram != 0 && (char)local_78 == '\0') {
      addgrams(local_88,ngram,skip_gram - 1,local_80,initial_length,gram_mask,skips + 1);
    }
  }
  return;
}

Assistant:

void addgrams(vw& all, size_t ngram, size_t skip_gram, features& fs, size_t initial_length, v_array<size_t>& gram_mask,
    size_t skips)
{
  if (ngram == 0 && gram_mask.last() < initial_length)
  {
    size_t last = initial_length - gram_mask.last();
    for (size_t i = 0; i < last; i++)
    {
      uint64_t new_index = fs.indicies[i];
      for (size_t n = 1; n < gram_mask.size(); n++)
        new_index = new_index * quadratic_constant + fs.indicies[i + gram_mask[n]];

      fs.push_back(1., new_index);
      if (fs.space_names.size() > 0)
      {
        string feature_name(fs.space_names[i].get()->second);
        for (size_t n = 1; n < gram_mask.size(); n++)
        {
          feature_name += string("^");
          feature_name += string(fs.space_names[i + gram_mask[n]].get()->second);
        }
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(fs.space_names[i].get()->first, feature_name)));
      }
    }
  }
  if (ngram > 0)
  {
    gram_mask.push_back(gram_mask.last() + 1 + skips);
    addgrams(all, ngram - 1, skip_gram, fs, initial_length, gram_mask, 0);
    gram_mask.pop();
  }
  if (skip_gram > 0 && ngram > 0)
    addgrams(all, ngram, skip_gram - 1, fs, initial_length, gram_mask, skips + 1);
}